

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string_const&,char_const(&)[26],std::__cxx11::string_const&,char_const(&)[3]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
                   char (*b) [26],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [3])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_170;
  cmAlphaNum local_138;
  cmAlphaNum local_100;
  cmAlphaNum local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  local_c8.RValueString_ = (string *)0x0;
  local_c8.View_._M_str = (a->_M_dataplus)._M_p;
  local_c8.View_._M_len = a->_M_string_length;
  local_90.first = cmAlphaNum::View(&local_c8);
  local_90.second = local_c8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_100,*b);
  local_78 = cmAlphaNum::View(&local_100);
  local_68 = local_100.RValueString_;
  local_138.RValueString_ = (string *)0x0;
  local_138.View_._M_str = (args->_M_dataplus)._M_p;
  local_138.View_._M_len = args->_M_string_length;
  local_60 = cmAlphaNum::View(&local_138);
  local_50 = local_138.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_170,*args_1);
  local_48 = cmAlphaNum::View(&local_170);
  local_38 = local_170.RValueString_;
  views._M_len = 4;
  views._M_array = &local_90;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}